

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::auxForward(Graph *this,Vertex *vertex,Edge *edge,int it)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  Edge *edge_00;
  bool bVar3;
  double dVar4;
  double dVar5;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  int local_3c;
  Edge *local_38;
  
  if (vertex == (Vertex *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n No NULL \n",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    return;
  }
  edge_00 = vertex->edgesList;
  while( true ) {
    if (edge_00 == (Edge *)0x0) {
      return;
    }
    if (edge_00->closed == false) {
      do {
        edge_00->activePowerFlow = 0.0;
        edge_00->reactivePowerFlow = 0.0;
        edge_00->activeLoss = 0.0;
        edge_00->reactiveLoss = 0.0;
        edge_00 = edge_00->nextEdge;
        bVar3 = edge_00 == (Edge *)0x0;
        if (bVar3) {
          return;
        }
      } while (edge_00->closed == false);
    }
    else {
      bVar3 = false;
    }
    if (bVar3) break;
    local_38 = edge;
    if (this->verticesList == vertex) {
      pVVar1 = edge_00->destiny;
      local_58 = Vertex::getActivePower(pVVar1);
      auxBranchActiveLoss(this,pVVar1,&local_58);
      dVar5 = local_58;
      pVVar1 = edge_00->destiny;
      local_58 = Vertex::getReactivePower(pVVar1);
      auxBranchReactiveLoss(this,pVVar1,&local_58);
      edge_00->activePowerFlow = dVar5 + edge_00->activeLoss;
      edge_00->reactivePowerFlow = local_58 + edge_00->reactiveLoss;
    }
    else {
      if (it < 1) {
        local_48 = 0.0;
        local_60 = 0.0;
      }
      else {
        dVar5 = edge->reactivePowerFlow * edge->reactivePowerFlow +
                edge->activePowerFlow * edge->activePowerFlow;
        local_60 = edge->origin->voltage;
        local_60 = local_60 * local_60;
        local_48 = (edge->resistance * dVar5) / local_60;
        local_60 = (dVar5 * edge->reactance) / local_60;
      }
      local_48 = edge->activePowerFlow - local_48;
      dVar5 = Vertex::getActivePower(vertex);
      edge_00->activePowerFlow = local_48 - dVar5;
      dVar5 = edge->reactivePowerFlow;
      dVar4 = Vertex::getReactivePower(vertex);
      edge_00->reactivePowerFlow = (dVar5 - local_60) - dVar4;
      if (1 < edge_00->origin->outdegree) {
        pEVar2 = vertex->edgesList;
        local_3c = it;
        if (pEVar2 == (Edge *)0x0) {
          local_60 = 0.0;
          dVar5 = 0.0;
        }
        else {
          dVar5 = 0.0;
          local_60 = 0.0;
          do {
            if ((pEVar2 != edge_00) && (pEVar2->closed == true)) {
              local_50 = pEVar2->activeLoss;
              pVVar1 = pEVar2->destiny;
              local_48 = dVar5;
              local_58 = Vertex::getActivePower(pVVar1);
              auxBranchActiveLoss(this,pVVar1,&local_58);
              local_60 = local_60 + local_50 + local_58;
              local_50 = pEVar2->reactiveLoss;
              pVVar1 = pEVar2->destiny;
              local_58 = Vertex::getReactivePower(pVVar1);
              auxBranchReactiveLoss(this,pVVar1,&local_58);
              dVar5 = local_48 + local_50 + local_58;
            }
            pEVar2 = pEVar2->nextEdge;
          } while (pEVar2 != (Edge *)0x0);
        }
        edge_00->activePowerFlow = edge_00->activePowerFlow - local_60;
        edge_00->reactivePowerFlow = edge_00->reactivePowerFlow - dVar5;
        it = local_3c;
      }
    }
    auxForward(this,edge_00->destiny,edge_00,it);
    edge_00 = edge_00->nextEdge;
    edge = local_38;
  }
  return;
}

Assistant:

void Graph::auxForward(Vertex *vertex, Edge *edge, int it){
    if(vertex == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        for(Edge *e = vertex->getEdgesList(); e!=NULL; e= e->getNext()){

            double active_power     = 0.0;
            double reactive_power   = 0.0;

            /// set open edges with flow-free
            while(e!=NULL && !e->isClosed() ){

                e->setActiveFlow(0.0);
                e->setReactiveFlow(0.0);
                e->setActiveLoss(0.0);
                e->setReactiveLoss(0.0);

                e = e->getNext();
            }
            if(e==NULL)
                break;

            //chute inicial para o fluxo nas arests que partem do no terminal
            if( vertex==this->verticesList ) {
                double activeLossCharge = branchActiveLoss(e->getDestiny());
                double reactiveLossCharge = branchReactiveLoss(e->getDestiny());

                e->setActiveFlow(activeLossCharge + e->getActiveLoss());
                e->setReactiveFlow(reactiveLossCharge + e->getReactiveLoss());

            } else {
                //a partir da primeira iteracao considera-se a perda calculada na iteracao anterior
                if(it>0){
                    active_power = edge->getResistance()*(pow(edge->getActivePowerFlow(), 2) + pow(edge->getReactivePowerFlow(), 2)) / pow(
                            edge->getOrigin()->getVoltage(), 2);    // Q = R*P^2 + Q^2/V^2
                    reactive_power =
                            edge->getReactance()*(pow(edge->getActivePowerFlow(), 2) + pow(edge->getReactivePowerFlow(), 2)) / pow(
                                    edge->getOrigin()->getVoltage(), 2);
                }

                e->setActiveFlow(edge->getActivePowerFlow() - active_power - vertex->getActivePower());
                e->setReactiveFlow(edge->getReactivePowerFlow() - reactive_power - vertex->getReactivePower());

                //bifurcacao - o fluxo que seque para o arco 'a' deve-se subtrair a soma de cargas e perdas dos ramos de bifurcacoes
                if(e->getOrigin()->getIndegree()>1){
                    double somaAtiv=0.0, somaReAtiv=0.0;
                    for(Edge *aux= vertex->getEdgesList(); aux!=NULL; aux= aux->getNext()){
                        if(aux!=e && aux->isClosed()==true){
                            somaAtiv+= aux->getActiveLoss() + branchActiveLoss(aux->getDestiny());
                            somaReAtiv+= aux->getReactiveLoss() + branchReactiveLoss(aux->getDestiny());
                        }
                    }

                    e->setActiveFlow(e->getActivePowerFlow() - somaAtiv);
                    e->setReactiveFlow(e->getReactivePowerFlow() - somaReAtiv);
                }
            }

            auxForward(e->getDestiny(), e, it);
        }
    }
}